

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OperatorExpressions.h
# Opt level: O2

void __thiscall
slang::ast::ConditionalExpression::visitExprs<slang::analysis::NonProceduralExprVisitor&>
          (ConditionalExpression *this,AlwaysFFVisitor *visitor)

{
  long lVar1;
  Condition *cond;
  pointer pCVar2;
  
  pCVar2 = (this->conditions)._M_ptr;
  for (lVar1 = (this->conditions)._M_extent._M_extent_value << 4; lVar1 != 0; lVar1 = lVar1 + -0x10)
  {
    Expression::visit<slang::analysis::NonProceduralExprVisitor&>((pCVar2->expr).ptr,visitor);
    if (pCVar2->pattern != (Pattern *)0x0) {
      Pattern::visit<slang::analysis::NonProceduralExprVisitor>(pCVar2->pattern,visitor);
    }
    pCVar2 = pCVar2 + 1;
  }
  Expression::visit<slang::analysis::NonProceduralExprVisitor&>(this->left_,visitor);
  Expression::visit<slang::analysis::NonProceduralExprVisitor&>(this->right_,visitor);
  return;
}

Assistant:

void visitExprs(TVisitor&& visitor) const {
        for (auto& cond : conditions) {
            cond.expr->visit(visitor);
            if (cond.pattern)
                cond.pattern->visit(visitor);
        }

        left().visit(visitor);
        right().visit(visitor);
    }